

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

block * lsvm::object::find_method(object_class *cls,symbol *name)

{
  entry *peVar1;
  
  do {
    peVar1 = hashmap::get(cls->methods,name);
    if (peVar1 != (entry *)0x0) {
      return (block *)peVar1->val;
    }
    cls = cls->super;
  } while (cls != (object_class_t *)0x0);
  return (block *)0x0;
}

Assistant:

block* find_method(object_class* cls, symbol* name){
    do {
        lsvm::hashmap::entry* e = lsvm::hashmap::get(cls->methods,name);
        if(e == null){
            cls = cls->super;
        }else{
            return (block*)e->val;
        }
    }while(cls != null);
    
    return null;    
}